

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntMathCommon.h
# Opt level: O0

bool IntMathCommon<long>::Div(long left,long right,long *pResult)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long *pResult_local;
  long right_local;
  long left_local;
  
  if (right == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/IntMathCommon.h"
                       ,0x60,"(right != 0)","Divide by zero...");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((right == -1) && (left == -0x8000000000000000)) {
    left_local._7_1_ = true;
  }
  else {
    *pResult = left / right;
    left_local._7_1_ = false;
  }
  return left_local._7_1_;
}

Assistant:

bool IntMathCommon<T>::Div(T left, T right, T *pResult)
{
    AssertMsg(right != 0, "Divide by zero...");

    if (right == -1 && left == MinValue)
    {
        // Special check for MinValue/-1
        return true;
    }

    *pResult = left / right;
    return false;
}